

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

void lj_ir_growtop(jit_State *J)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  void *in_RDI;
  MSize szins;
  lua_State *unaff_retaddr;
  IRIns *baseir;
  MSize nsz;
  MSize osz;
  
  lVar2 = *(long *)((long)in_RDI + 0x100) + (ulong)*(uint *)((long)in_RDI + 0x10c) * 8;
  iVar1 = *(int *)((long)in_RDI + 0x108) - *(int *)((long)in_RDI + 0x10c);
  nsz = (MSize)lVar2;
  osz = (MSize)((ulong)lVar2 >> 0x20);
  if (iVar1 == 0) {
    pvVar3 = lj_mem_realloc(unaff_retaddr,in_RDI,osz,nsz);
    *(undefined4 *)((long)in_RDI + 0x10c) = 0x7ff8;
    *(int *)((long)in_RDI + 0x108) = *(int *)((long)in_RDI + 0x10c) + 0x20;
  }
  else {
    pvVar3 = lj_mem_realloc(unaff_retaddr,in_RDI,osz,nsz);
    *(int *)((long)in_RDI + 0x108) = *(int *)((long)in_RDI + 0x10c) + iVar1 * 2;
  }
  pvVar3 = (void *)((long)pvVar3 + (ulong)*(uint *)((long)in_RDI + 0x10c) * -8);
  *(void **)((long)in_RDI + 0x100) = pvVar3;
  *(void **)((long)in_RDI + 0x10) = pvVar3;
  return;
}

Assistant:

void LJ_FASTCALL lj_ir_growtop(jit_State *J)
{
  IRIns *baseir = J->irbuf + J->irbotlim;
  MSize szins = J->irtoplim - J->irbotlim;
  if (szins) {
    baseir = (IRIns *)lj_mem_realloc(J->L, baseir, szins*sizeof(IRIns),
				     2*szins*sizeof(IRIns));
    J->irtoplim = J->irbotlim + 2*szins;
  } else {
    baseir = (IRIns *)lj_mem_realloc(J->L, NULL, 0, LJ_MIN_IRSZ*sizeof(IRIns));
    J->irbotlim = REF_BASE - LJ_MIN_IRSZ/4;
    J->irtoplim = J->irbotlim + LJ_MIN_IRSZ;
  }
  J->cur.ir = J->irbuf = baseir - J->irbotlim;
}